

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O2

int prune_intra_y_mode(int64_t this_model_rd,int64_t *best_model_rd,int64_t *top_intra_model_rd,
                      int max_model_cnt_allowed,int model_rd_index_for_pruning)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar5;
  long lVar4;
  
  uVar2 = 0;
  uVar5 = 0;
  if (0 < max_model_cnt_allowed) {
    uVar5 = (ulong)(uint)max_model_cnt_allowed;
  }
  while( true ) {
    if (uVar5 == uVar2) goto LAB_0021fe6d;
    if (this_model_rd < top_intra_model_rd[uVar2]) break;
    uVar2 = uVar2 + 1;
  }
  lVar4 = (long)max_model_cnt_allowed;
  while (lVar3 = lVar4 + -1, (long)uVar2 < lVar3) {
    top_intra_model_rd[lVar3] = top_intra_model_rd[lVar4 + -2];
    lVar4 = lVar3;
  }
  top_intra_model_rd[uVar2] = this_model_rd;
LAB_0021fe6d:
  iVar1 = 1;
  if ((((top_intra_model_rd[model_rd_index_for_pruning] == 0x7fffffffffffffff) ||
       ((double)this_model_rd <= (double)top_intra_model_rd[model_rd_index_for_pruning])) &&
      ((this_model_rd == 0x7fffffffffffffff ||
       ((double)this_model_rd <= (double)*best_model_rd * 1.5)))) &&
     (iVar1 = 0, this_model_rd < *best_model_rd)) {
    *best_model_rd = this_model_rd;
  }
  return iVar1;
}

Assistant:

static int prune_intra_y_mode(int64_t this_model_rd, int64_t *best_model_rd,
                              int64_t top_intra_model_rd[],
                              int max_model_cnt_allowed,
                              int model_rd_index_for_pruning) {
  const double thresh_best = 1.50;
  const double thresh_top = 1.00;
  for (int i = 0; i < max_model_cnt_allowed; i++) {
    if (this_model_rd < top_intra_model_rd[i]) {
      for (int j = max_model_cnt_allowed - 1; j > i; j--) {
        top_intra_model_rd[j] = top_intra_model_rd[j - 1];
      }
      top_intra_model_rd[i] = this_model_rd;
      break;
    }
  }
  if (top_intra_model_rd[model_rd_index_for_pruning] != INT64_MAX &&
      this_model_rd >
          thresh_top * top_intra_model_rd[model_rd_index_for_pruning])
    return 1;

  if (this_model_rd != INT64_MAX &&
      this_model_rd > thresh_best * (*best_model_rd))
    return 1;
  if (this_model_rd < *best_model_rd) *best_model_rd = this_model_rd;
  return 0;
}